

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_hdr_looks_good(nifti_1_header *hdr)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  char *__format;
  short *psVar7;
  
  iVar3 = need_nhdr_swap(hdr->dim[0],hdr->sizeof_hdr);
  iVar6 = 0;
  if ((iVar3 < 0) && (iVar6 = 1, 0 < g_opts_0)) {
    fprintf(_stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",(ulong)(uint)(int)hdr->dim[0],
            (ulong)(uint)hdr->sizeof_hdr);
  }
  sVar2 = hdr->dim[0];
  if (0 < sVar2) {
    psVar7 = hdr->dim;
    uVar5 = 1;
    do {
      psVar7 = psVar7 + 1;
      if (*psVar7 < 1) {
        if (0 < g_opts_0) {
          fprintf(_stderr,"** bad nhdr field: dim[%d] = %d\n",uVar5 & 0xffffffff);
          sVar2 = hdr->dim[0];
        }
        iVar6 = iVar6 + 1;
      }
      if (6 < uVar5) break;
      bVar1 = (long)uVar5 < (long)sVar2;
      uVar5 = uVar5 + 1;
    } while (bVar1);
  }
  if ((((hdr->magic[0] == 'n') && (hdr->magic[3] == '\0')) &&
      ((hdr->magic[1] == 'i' || (hdr->magic[1] == '+')))) && ((byte)(hdr->magic[2] - 0x31U) < 9)) {
    if (hdr->datatype != 1) {
      uVar5 = 0x2b;
      do {
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
        if (nifti_type_list[uVar5].type == (int)hdr->datatype) goto LAB_0010c5ed;
      } while (1 < uVar4);
    }
    if (g_opts_0 < 1) goto LAB_0010c5eb;
    __format = "** bad NIFTI datatype in hdr, %d\n";
  }
  else {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-- nhdr magic field implies ANALYZE: magic = \'%.4s\'\n",hdr->magic);
    }
    uVar5 = 0x2b;
    do {
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      if (nifti_type_list[uVar5].type == (int)hdr->datatype) goto LAB_0010c5ed;
    } while (1 < uVar4);
    if (g_opts_0 < 1) goto LAB_0010c5eb;
    __format = "** bad ANALYZE datatype in hdr, %d\n";
  }
  fprintf(_stderr,__format);
LAB_0010c5eb:
  iVar6 = iVar6 + 1;
LAB_0010c5ed:
  iVar3 = 0;
  if ((iVar6 == 0) && (iVar3 = 1, 2 < g_opts_0)) {
    nifti_hdr_looks_good_cold_1();
  }
  return iVar3;
}

Assistant:

int nifti_hdr_looks_good(const nifti_1_header * hdr)
{
   int is_nifti, c, errs = 0;

   /* check dim[0] and sizeof_hdr */
   if( need_nhdr_swap(hdr->dim[0], hdr->sizeof_hdr) < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",
                 hdr->dim[0], hdr->sizeof_hdr);
      errs++;
   }

   /* check the valid dimension sizes (maybe dim[0] is bad) */
   for( c = 1; c <= hdr->dim[0] && c <= 7; c++ )
      if( hdr->dim[c] <= 0 ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad nhdr field: dim[%d] = %d\n",c,hdr->dim[c]);
         errs++;
      }

   is_nifti = NIFTI_VERSION(*hdr);      /* determine header type */

   if( is_nifti ){      /* NIFTI */

      if( ! nifti_datatype_is_valid(hdr->datatype, 1) ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad NIFTI datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }

   } else {             /* ANALYZE 7.5 */

      if( g_opts.debug > 1 )  /* maybe tell user it's an ANALYZE hdr */
         fprintf(stderr,
            "-- nhdr magic field implies ANALYZE: magic = '%.4s'\n",hdr->magic);

      if( ! nifti_datatype_is_valid(hdr->datatype, 0) ){
         if( g_opts.debug > 0 )
           fprintf(stderr,"** bad ANALYZE datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }
   }

   if( errs ) return 0;  /* problems */

   if( g_opts.debug > 2 ) fprintf(stderr,"-d nifti header looks good\n");

   return 1;   /* looks good */
}